

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessing.cc
# Opt level: O0

void bidirectional::detectNegativeCostCycle(DiGraph *graph_ptr)

{
  bool bVar1;
  BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  *this;
  long in_RDI;
  LemonPath path;
  BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  BF;
  LemonNode *source;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  unique_ptr<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>
  *in_stack_ffffffffffffff40;
  BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  *this_00;
  undefined4 in_stack_ffffffffffffff50;
  Node in_stack_ffffffffffffff54;
  BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  local_68;
  int local_14;
  int *local_10;
  long local_8;
  
  local_8 = in_RDI;
  local_14 = (int)DiGraph::getLNodeFromId
                            ((DiGraph *)
                             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                             (int *)0x2c3a43);
  local_10 = &local_14;
  this = (BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
          *)std::unique_ptr<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>::
            operator*(in_stack_ffffffffffffff40);
  std::
  unique_ptr<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  ::operator*((unique_ptr<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
               *)this);
  this_00 = &local_68;
  lemon::
  BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  ::BellmanFord(this,(Digraph *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                (LengthMap *)0x2c3a98);
  lemon::
  BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  ::run(this_00,in_stack_ffffffffffffff54,(int)((ulong)this >> 0x20));
  lemon::
  BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  ::negativeCycle((BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                   *)path.head.
                     super__Vector_base<lemon::SmartDigraphBase::Arc,_std::allocator<lemon::SmartDigraphBase::Arc>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = lemon::Path<lemon::SmartDigraph>::empty((Path<lemon::SmartDigraph> *)this);
  if (bVar1) {
    *(undefined4 *)(local_8 + 0x48) = 1;
  }
  else {
    *(undefined4 *)(local_8 + 0x48) = 0;
  }
  lemon::Path<lemon::SmartDigraph>::~Path((Path<lemon::SmartDigraph> *)this);
  lemon::
  BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
  ::~BellmanFord((BellmanFord<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_lemon::BellmanFordDefaultTraits<lemon::SmartDigraph,_lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff54._id,in_stack_ffffffffffffff50));
  return;
}

Assistant:

void detectNegativeCostCycle(DiGraph* graph_ptr) {
  const LemonNode& source =
      graph_ptr->getLNodeFromId(graph_ptr->source.lemon_id);
  lemon::BellmanFord<LemonGraph, LemonGraph::ArcMap<double>> BF(
      *graph_ptr->lemon_graph_ptr, *graph_ptr->weight_map_ptr);
  BF.run(source, graph_ptr->number_edges);
  LemonPath path = BF.negativeCycle();

  // Update negative_cost_cycle_present member
  if (path.empty())
    graph_ptr->negative_cost_cycle_present = FALSE;
  else
    graph_ptr->negative_cost_cycle_present = TRUE;
}